

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

bool_t objIsOperable2(void *obj)

{
  bool_t bVar1;
  size_t *in_RDI;
  bool local_9;
  
  bVar1 = memIsValid(in_RDI,0x18);
  local_9 = false;
  if (bVar1 != 0) {
    bVar1 = memIsValid(in_RDI,*in_RDI);
    local_9 = false;
    if ((bVar1 != 0) && (local_9 = false, in_RDI[2] <= in_RDI[1])) {
      local_9 = in_RDI[1] * 8 + 0x18 <= *in_RDI;
    }
  }
  return (bool_t)local_9;
}

Assistant:

bool_t objIsOperable2(const void* obj)
{
	return memIsValid(obj, sizeof(obj_hdr_t)) &&
		memIsValid(obj, objKeep(obj)) &&
		objOCount(obj) <= objPCount(obj) &&
		sizeof(obj_hdr_t) + sizeof(void*) * objPCount(obj) <= objKeep(obj);
}